

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  long *plVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  ulong in_RAX;
  undefined8 uVar4;
  CURLcode *pCVar5;
  undefined8 uVar6;
  CURLcode *pCVar7;
  _Bool bdone;
  undefined8 uStack_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pCVar7 = (CURLcode *)cf->ctx;
    uVar4 = *(undefined8 *)(pCVar7 + 0x26);
    uStack_38 = in_RAX;
    if (uVar4 != CURLE_OK) {
      pCVar5 = pCVar7 + 0x16;
      uVar6 = CURLE_OK;
      do {
        uStack_38 = uStack_38 & 0xffffffffffffff;
        plVar1 = *(long **)(pCVar5 + -10);
        if (((plVar1 != (long *)0x0) && (pCVar5[-8] == CURLE_OK)) &&
           ((*pCVar5 & CURLE_UNSUPPORTED_PROTOCOL) == CURLE_OK)) {
          CVar3 = (**(code **)(*plVar1 + 0x28))(plVar1,data,(long)&uStack_38 + 7);
          pCVar5[-8] = CVar3;
          if ((CVar3 != CURLE_OK) || (uStack_38._7_1_ == '\x01')) {
            *(undefined1 *)pCVar5 = (char)*pCVar5 | CURLE_UNSUPPORTED_PROTOCOL;
          }
        }
        uVar6 = uVar6 + CURLE_UNSUPPORTED_PROTOCOL;
        uVar4 = *(undefined8 *)(pCVar7 + 0x26);
        pCVar5 = pCVar5 + 0xe;
      } while ((ulong)uVar6 < (ulong)uVar4);
    }
    *done = true;
    if (uVar4 != CURLE_OK) {
      pCVar5 = pCVar7 + 0x16;
      uVar6 = uVar4;
      do {
        if ((*pCVar5 & CURLE_UNSUPPORTED_PROTOCOL) == CURLE_OK) {
          *done = false;
        }
        pCVar5 = pCVar5 + 0xe;
        uVar6 = uVar6 - CURLE_UNSUPPORTED_PROTOCOL;
      } while (uVar6 != CURLE_OK);
    }
    CVar3 = CURLE_OK;
    if (uVar4 != CURLE_OK && *done == true) {
      CVar3 = CURLE_OK;
      do {
        pCVar7 = pCVar7 + 0xe;
        if (*pCVar7 != CURLE_OK) {
          CVar3 = *pCVar7;
        }
        uVar4 = uVar4 - CURLE_UNSUPPORTED_PROTOCOL;
      } while (uVar4 != CURLE_OK);
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar3;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar3;
        }
        if (pcVar2->log_level < 1) {
          return CVar3;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"shutdown -> %d, done=%d",(ulong)CVar3);
      }
    }
  }
  else {
    *done = true;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  for(i = 0; i < ctx->baller_count; i++) {
    struct cf_hc_baller *b = &ctx->ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < ctx->baller_count; i++) {
    if(!ctx->ballers[i].shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        result = ctx->ballers[i].result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}